

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall google::protobuf::DescriptorPool::Tables::RollbackToLastCheckpoint(Tables *this)

{
  pointer *ppCVar1;
  pointer pCVar2;
  pointer ppcVar3;
  pointer ppVar4;
  long lVar5;
  ulong uVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  pVar7;
  
  pCVar2 = (this->checkpoints_).
           super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppcVar3 = (this->symbols_after_checkpoint_).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = (ulong)pCVar2[-1].pending_symbols_before_checkpoint;
  if (uVar6 < (ulong)((long)(this->symbols_after_checkpoint_).
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppcVar3 >> 3)) {
    lVar5 = uVar6 * 8;
    do {
      std::
      _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(this->symbols_by_name_)._M_h,(long)ppcVar3 + lVar5);
      uVar6 = uVar6 + 1;
      ppcVar3 = (this->symbols_after_checkpoint_).
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 8;
    } while (uVar6 < (ulong)((long)(this->symbols_after_checkpoint_).
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar3 >> 3));
  }
  uVar6 = (ulong)pCVar2[-1].pending_files_before_checkpoint;
  ppcVar3 = (this->files_after_checkpoint_).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar6 < (ulong)((long)(this->files_after_checkpoint_).
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppcVar3 >> 3)) {
    lVar5 = uVar6 * 8;
    do {
      std::
      _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(this->files_by_name_)._M_h,(long)ppcVar3 + lVar5);
      uVar6 = uVar6 + 1;
      ppcVar3 = (this->files_after_checkpoint_).
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 8;
    } while (uVar6 < (ulong)((long)(this->files_after_checkpoint_).
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar3 >> 3));
  }
  uVar6 = (ulong)pCVar2[-1].pending_extensions_before_checkpoint;
  ppVar4 = (this->extensions_after_checkpoint_).
           super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar6 < (ulong)((long)(this->extensions_after_checkpoint_).
                            super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 4)) {
    lVar5 = uVar6 << 4;
    do {
      pVar7 = std::
              _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
              ::equal_range(&(this->extensions_)._M_t,(key_type *)((long)&ppVar4->first + lVar5));
      std::
      _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
      ::_M_erase_aux(&(this->extensions_)._M_t,(_Base_ptr)pVar7.first._M_node,
                     (_Base_ptr)pVar7.second._M_node);
      uVar6 = uVar6 + 1;
      ppVar4 = (this->extensions_after_checkpoint_).
               super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(this->extensions_after_checkpoint_).
                                   super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 4));
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->symbols_after_checkpoint_,(long)pCVar2[-1].pending_symbols_before_checkpoint);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->files_after_checkpoint_,(long)pCVar2[-1].pending_files_before_checkpoint);
  std::
  vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ::resize(&this->extensions_after_checkpoint_,(long)pCVar2[-1].pending_extensions_before_checkpoint
          );
  std::
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::resize(&this->strings_,(long)pCVar2[-1].strings_before_checkpoint);
  std::
  vector<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>,_std::allocator<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>_>_>
  ::resize(&this->messages_,(long)pCVar2[-1].messages_before_checkpoint);
  std::
  vector<std::unique_ptr<std::once_flag,_std::default_delete<std::once_flag>_>,_std::allocator<std::unique_ptr<std::once_flag,_std::default_delete<std::once_flag>_>_>_>
  ::resize(&this->once_dynamics_,(long)pCVar2[-1].once_dynamics_before_checkpoint);
  std::
  vector<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>,_std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>_>_>
  ::resize(&this->file_tables_,(long)pCVar2[-1].file_tables_before_checkpoint);
  std::
  vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  ::resize(&this->allocations_,(long)pCVar2[-1].allocations_before_checkpoint);
  ppCVar1 = &(this->checkpoints_).
             super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppCVar1 = *ppCVar1 + -1;
  return;
}

Assistant:

void DescriptorPool::Tables::RollbackToLastCheckpoint() {
  GOOGLE_DCHECK(!checkpoints_.empty());
  const CheckPoint& checkpoint = checkpoints_.back();

  for (int i = checkpoint.pending_symbols_before_checkpoint;
       i < symbols_after_checkpoint_.size(); i++) {
    symbols_by_name_.erase(symbols_after_checkpoint_[i]);
  }
  for (int i = checkpoint.pending_files_before_checkpoint;
       i < files_after_checkpoint_.size(); i++) {
    files_by_name_.erase(files_after_checkpoint_[i]);
  }
  for (int i = checkpoint.pending_extensions_before_checkpoint;
       i < extensions_after_checkpoint_.size(); i++) {
    extensions_.erase(extensions_after_checkpoint_[i]);
  }

  symbols_after_checkpoint_.resize(
      checkpoint.pending_symbols_before_checkpoint);
  files_after_checkpoint_.resize(checkpoint.pending_files_before_checkpoint);
  extensions_after_checkpoint_.resize(
      checkpoint.pending_extensions_before_checkpoint);

  strings_.resize(checkpoint.strings_before_checkpoint);
  messages_.resize(checkpoint.messages_before_checkpoint);
  once_dynamics_.resize(checkpoint.once_dynamics_before_checkpoint);
  file_tables_.resize(checkpoint.file_tables_before_checkpoint);
  allocations_.resize(checkpoint.allocations_before_checkpoint);
  checkpoints_.pop_back();
}